

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateTemplateNode::TemplateTemplateNode
          (TemplateTemplateNode *this,TemplateToken *token,Strip strip,string *indentation)

{
  ModifierAndValue local_38;
  
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR__TemplateTemplateNode_00153248;
  TemplateToken::TemplateToken(&this->token_,token);
  anon_unknown_14::HashedTemplateString::HashedTemplateString
            (&this->variable_,(this->token_).text,(this->token_).textlen);
  this->strip_ = strip;
  std::__cxx11::string::string((string *)&this->indentation_,(string *)indentation);
  local_38.value_len = (this->indentation_)._M_string_length;
  if (local_38.value_len != 0) {
    local_38.value = (this->indentation_)._M_dataplus._M_p;
    local_38.modifier_info = (ModifierInfo *)(anonymous_namespace)::g_prefix_line_info;
    std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
    emplace_back<ctemplate::ModifierAndValue>(&(this->token_).modvals,&local_38);
  }
  return;
}

Assistant:

explicit TemplateTemplateNode(const TemplateToken& token, Strip strip,
                                const string& indentation)
      : token_(token),
        variable_(token_.text, token_.textlen),
        strip_(strip), indentation_(indentation) {
    VLOG(2) << "Constructing TemplateTemplateNode: "
            << string(token_.text, token_.textlen) << endl;

    // If this template is indented (eg, " {{>SUBTPL}}"), make sure
    // every line of the expanded template is indented, not just the
    // first one.  We do this by adding a modifier that applies to
    // the entire template node, that inserts spaces after newlines.
    if (!indentation_.empty()) {
      token_.modvals.push_back(ModifierAndValue(&g_prefix_line_info,
                                                indentation_.data(),
                                                indentation_.length()));
    }
  }